

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cc
# Opt level: O2

unique_ptr<flow::lang::VariableSym,_std::default_delete<flow::lang::VariableSym>_> __thiscall
flow::lang::Parser::varDecl(Parser *this)

{
  bool bVar1;
  Parser *in_RSI;
  undefined1 local_70 [8];
  string name;
  SourceLocation loc;
  
  SourceLocation::SourceLocation
            (&loc,&((in_RSI->lexer_)._M_t.
                    super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>
                    .super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl)->location_);
  bVar1 = consume(in_RSI,Var);
  if (bVar1) {
    bVar1 = consume(in_RSI,Ident);
    if (bVar1) {
      stringValue_abi_cxx11_(&name,in_RSI);
      bVar1 = consume(in_RSI,Assign);
      if (bVar1) {
        logicExpr((Parser *)local_70);
        if (local_70 == (undefined1  [8])0x0) goto LAB_0011edb0;
        loc.end.offset = *(uint *)((long)local_70 + 0x3c);
        loc.end._0_8_ = *(undefined8 *)((long)local_70 + 0x34);
        consume(in_RSI,Semicolon);
        std::
        make_unique<flow::lang::VariableSym,std::__cxx11::string&,std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>,flow::SourceLocation&>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                   (unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)&name,
                   (SourceLocation *)local_70);
        if (local_70 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_70 + 8))();
        }
      }
      else {
LAB_0011edb0:
        *(undefined8 *)&(this->features_)._M_t._M_impl = 0;
      }
      std::__cxx11::string::~string((string *)&name);
      goto LAB_0011edbe;
    }
  }
  *(undefined8 *)&(this->features_)._M_t._M_impl = 0;
LAB_0011edbe:
  std::__cxx11::string::~string((string *)&loc);
  return (__uniq_ptr_data<flow::lang::VariableSym,_std::default_delete<flow::lang::VariableSym>,_true,_true>
          )(__uniq_ptr_data<flow::lang::VariableSym,_std::default_delete<flow::lang::VariableSym>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<VariableSym> Parser::varDecl() {
  SourceLocation loc(lexer_->location());

  if (!consume(Token::Var)) return nullptr;

  if (!consume(Token::Ident)) return nullptr;

  std::string name = stringValue();

  if (!consume(Token::Assign)) return nullptr;

  std::unique_ptr<Expr> initializer = expr();
  if (!initializer) return nullptr;

  loc.update(initializer->location().end);
  consume(Token::Semicolon);

  return std::make_unique<VariableSym>(name, std::move(initializer), loc);
}